

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kitDsd.c
# Opt level: O2

int Kit_DsdCofactoringGetVars(Kit_DsdNtk_t **ppNtk,int nSize,int *pVars)

{
  ushort uVar1;
  Kit_DsdObj_t *pKVar2;
  Kit_DsdObj_t KVar3;
  int iVar4;
  ulong uVar5;
  long lVar6;
  ulong uVar7;
  uint uVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  
  uVar11 = 0;
  uVar9 = (ulong)(uint)nSize;
  if (nSize < 1) {
    uVar9 = uVar11;
  }
  uVar8 = 0;
  do {
    if (uVar11 == uVar9) {
      return uVar8;
    }
    for (uVar10 = 0;
        (uVar10 < ppNtk[uVar11]->nNodes &&
        (pKVar2 = ppNtk[uVar11]->pNodes[uVar10], pKVar2 != (Kit_DsdObj_t *)0x0));
        uVar10 = uVar10 + 1) {
      KVar3 = *pKVar2;
      if (((uint)KVar3 & 0xfc000000) != 0xc000000 && ((uint)KVar3 & 0x1c0) == 0x140) {
        for (uVar12 = 0; uVar12 < (uint)KVar3 >> 0x1a; uVar12 = uVar12 + 1) {
          uVar1 = *(ushort *)((long)&pKVar2[1].field_0x0 + uVar12 * 2);
          iVar4 = Kit_DsdLitIsLeaf(ppNtk[uVar11],(uint)uVar1);
          if (iVar4 != 0) {
            iVar4 = Abc_Lit2Var((uint)uVar1);
            uVar5 = 0;
            if (0 < (int)uVar8) {
              uVar5 = (ulong)uVar8;
            }
            for (uVar7 = 0; uVar5 != uVar7; uVar7 = uVar7 + 1) {
              if (pVars[uVar7] == iVar4) {
                uVar5 = uVar7 & 0xffffffff;
                break;
              }
            }
            if ((uint)uVar5 == uVar8) {
              lVar6 = (long)(int)uVar8;
              uVar8 = uVar8 + 1;
              pVars[lVar6] = iVar4;
            }
          }
          KVar3 = *pKVar2;
        }
      }
    }
    uVar11 = uVar11 + 1;
  } while( true );
}

Assistant:

int Kit_DsdCofactoringGetVars( Kit_DsdNtk_t ** ppNtk, int nSize, int * pVars )
{
    Kit_DsdObj_t * pObj;
    unsigned m;
    int i, k, v, Var, nVars, iFaninLit;
    // go through all the networks
    nVars = 0;
    for ( i = 0; i < nSize; i++ )
    {
        // go through the prime objects of each networks
        Kit_DsdNtkForEachObj( ppNtk[i], pObj, k )     
        {
            if ( pObj->Type != KIT_DSD_PRIME )
                continue;
            if ( pObj->nFans == 3 )
                continue;
            // collect direct fanin variables
            Kit_DsdObjForEachFanin( ppNtk[i], pObj, iFaninLit, m )
            {
                if ( !Kit_DsdLitIsLeaf(ppNtk[i], iFaninLit) )
                    continue;
                // add it to the array
                Var = Abc_Lit2Var( iFaninLit );
                for ( v = 0; v < nVars; v++ )
                    if ( pVars[v] == Var )
                        break;
                if ( v == nVars )
                    pVars[nVars++] = Var;
            }
        }
    }
    return nVars;
}